

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *snippetstring)

{
  uint uVar1;
  string sourceName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"(manual callfixup name=\"",name);
  std::operator+(&sourceName,&local_48,"\")");
  std::__cxx11::string::~string((string *)&local_48);
  uVar1 = (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,&sourceName,name,1);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_PcodeInjectLibrary).injection.
              super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar1][1].name);
  (*(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(this,(ulong)uVar1);
  std::__cxx11::string::~string((string *)&sourceName);
  return uVar1;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallFixup(const string &name,const string &snippetstring)

{
  string sourceName = "(manual callfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  payload->parsestring = snippetstring;
  registerInject(injectid);
  return injectid;
}